

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

int rtr_bgpsec_generate_signature
              (rtr_bgpsec *data,uint8_t *private_key,rtr_signature_seg **new_signature)

{
  int iVar1;
  rtr_signature_seg *prVar2;
  size_t sVar3;
  uint8_t *bytes;
  long in_FS_OFFSET;
  uint8_t *curr;
  stream *psStack_50;
  uint stream_size;
  stream *s;
  int req_sig_size;
  rtr_bgpsec_rtvals retval;
  rtr_signature_seg **new_signature_local;
  uint8_t *private_key_local;
  rtr_bgpsec *data_local;
  EC_KEY *local_20;
  EC_KEY *priv_key;
  uchar *hash_result;
  
  hash_result = *(uchar **)(in_FS_OFFSET + 0x28);
  priv_key = (EC_KEY *)0x0;
  psStack_50 = (stream *)0x0;
  local_20 = (EC_KEY *)0x0;
  if ((((data == (rtr_bgpsec *)0x0) || (data->path == (rtr_secure_path_seg *)0x0)) ||
      (private_key == (uint8_t *)0x0)) || (*new_signature != (rtr_signature_seg *)0x0)) {
    data_local._4_4_ = -9;
  }
  else {
    iVar1 = rtr_bgpsec_has_algorithm_suite(data->alg);
    if (iVar1 == -1) {
      data_local._4_4_ = -6;
    }
    else if ((data->nlri->afi == 1) || (data->nlri->afi == 2)) {
      if ((uint)data->path_len == data->sigs_len + 1) {
        iVar1 = load_private_key(&local_20,private_key);
        if (iVar1 == 0) {
          iVar1 = ECDSA_size((EC_KEY *)local_20);
          if (iVar1 == 0) {
            s._4_4_ = -3;
          }
          else {
            prVar2 = rtr_bgpsec_new_signature_seg((uint8_t *)0x0,(uint16_t)iVar1,(uint8_t *)0x0);
            *new_signature = prVar2;
            if (*new_signature == (rtr_signature_seg *)0x0) {
              s._4_4_ = -1;
            }
            else {
              (*new_signature)->sig_len = 0;
              sVar3 = req_stream_size(data,SIGNING);
              psStack_50 = init_stream((uint16_t)sVar3);
              s._4_4_ = align_byte_sequence(data,psStack_50,SIGNING);
              if (s._4_4_ == 0) {
                bytes = get_stream_start(psStack_50);
                sVar3 = get_stream_size(psStack_50);
                s._4_4_ = hash_byte_sequence(bytes,sVar3,data->alg,(uchar **)&priv_key);
                if (s._4_4_ == 0) {
                  s._4_4_ = sign_byte_sequence((uint8_t *)priv_key,local_20,data->alg,*new_signature
                                              );
                }
              }
            }
          }
        }
        else {
          s._4_4_ = -3;
        }
        if (priv_key != (EC_KEY *)0x0) {
          lrtr_free(priv_key);
        }
        if ((*new_signature != (rtr_signature_seg *)0x0) && (s._4_4_ == -5)) {
          rtr_bgpsec_free_signatures(*new_signature);
        }
        if (psStack_50 != (stream *)0x0) {
          free_stream(psStack_50);
        }
        if (local_20 != (EC_KEY *)0x0) {
          EC_KEY_free((EC_KEY *)local_20);
          local_20 = (EC_KEY *)0x0;
        }
        data_local._4_4_ = s._4_4_;
      }
      else {
        data_local._4_4_ = -8;
      }
    }
    else {
      data_local._4_4_ = -7;
    }
  }
  if (*(uchar **)(in_FS_OFFSET + 0x28) != hash_result) {
    __stack_chk_fail();
  }
  return data_local._4_4_;
}

Assistant:

int rtr_bgpsec_generate_signature(const struct rtr_bgpsec *data, uint8_t *private_key,
				  struct rtr_signature_seg **new_signature)
{
	/* The signature generation result. */
	enum rtr_bgpsec_rtvals retval = 0;

	/* The resulting hash. */
	unsigned char *hash_result = NULL;

	/* The required size for the signature */
	int req_sig_size = 0;

	/* A stream that holds the data that is hashed */
	struct stream *s = NULL;

	/* Total size of required space for the stream */
	unsigned int stream_size = 0;

	/* OpenSSL private key structure. */
	EC_KEY *priv_key = NULL;

	/* Check, if the parameters are not NULL except for *new_signature,
	 * which must be NULL.
	 */
	if (!data || !data->path || !private_key || *new_signature)
		return RTR_BGPSEC_INVALID_ARGUMENTS;

	/* Make sure the algorithm suite is supported. */
	if (rtr_bgpsec_has_algorithm_suite(data->alg) == RTR_BGPSEC_ERROR)
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;

	/* Check, if the AFI is usable with BGPsec */
	if ((data->nlri->afi != BGPSEC_IPV4) && (data->nlri->afi != BGPSEC_IPV6))
		return RTR_BGPSEC_UNSUPPORTED_AFI;

	/* Check, if there is one more secure path segment than there are
	 * signature segments. This is because the next signature is generated
	 * for a secure path segment, that was not signed yet (the last appended
	 * secure path segment).
	 */
	if (data->path_len != (data->sigs_len + 1))
		return RTR_BGPSEC_WRONG_SEGMENT_COUNT;

	/* Load the private key from buffer into OpenSSL structure. */
	retval = load_private_key(&priv_key, private_key);

	if (retval != RTR_BGPSEC_SUCCESS) {
		retval = RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;
		goto err;
	}

	/* Allocate the needed space for the signature */
	req_sig_size = ECDSA_size(priv_key);
	if (req_sig_size == 0) {
		retval = RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;
		goto err;
	}

	*new_signature = rtr_bgpsec_new_signature_seg(NULL, req_sig_size, NULL);
	if (!(*new_signature)) {
		retval = RTR_BGPSEC_ERROR;
		goto err;
	}

	/* The function call above expects the exact size of the signature.
	 * Because the signature was not generated yet, we pass the maximum
	 * possible length to it so enough space is allocated. Then, the
	 * sig_len field is set to 0, since the signature does not exist yet.
	 * This is a rather hacky workaround and might get changed in the
	 * future.
	 */
	(*new_signature)->sig_len = 0;

	/* Calculate the required stream size and initialize the stream */
	stream_size = req_stream_size(data, SIGNING);
	s = init_stream(stream_size);

	/* Align the bytes to prepare them for hashing. */
	retval = align_byte_sequence(data, s, SIGNING);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Hash the aligned bytes. */
	uint8_t *curr = get_stream_start(s);

	retval = hash_byte_sequence(curr, get_stream_size(s), data->alg, &hash_result);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Sign the hash depending on the algorithm suite. */
	retval = sign_byte_sequence(hash_result, priv_key, data->alg, *new_signature);

err:
	if (hash_result)
		lrtr_free(hash_result);
	if (*new_signature && (retval == RTR_BGPSEC_SIGNING_ERROR))
		rtr_bgpsec_free_signatures(*new_signature);
	if (s)
		free_stream(s);
	if (priv_key) {
		EC_KEY_free(priv_key);
		priv_key = NULL;
	}

	return retval;
}